

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newRow,bool scale)

{
  int *piVar1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Item *pIVar2;
  Item *this_01;
  uint uVar3;
  int iVar4;
  int iVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  int iVar7;
  byte bVar8;
  int *piVar9;
  undefined7 in_register_00000009;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  char *__filename;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  soplex *psVar19;
  long lVar20;
  bool bVar21;
  byte bVar22;
  int idx;
  uint local_1c4;
  undefined4 local_1c0;
  int local_1bc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  int local_b8;
  int local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_b0;
  
  bVar22 = 0;
  local_1c0 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar2 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[(uint)n].idx;
    lVar20 = (long)(pIVar2->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    local_1c4 = n;
    if (0 < lVar20) {
      do {
        this_01 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey
                  [(pIVar2->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem[lVar20 + -1].idx].idx;
        pNVar6 = (this_01->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar6 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) ||
           (pcVar10 = (char *)(long)(this_01->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .memused, (long)pcVar10 < 1)) {
LAB_004fd2ea:
          __filename = (char *)0xffffffff;
        }
        else {
          if (pNVar6->idx == local_1c4) {
            bVar21 = true;
            __filename = (char *)0x0;
          }
          else {
            __filename = (char *)0x0;
            piVar9 = &pNVar6[1].idx;
            do {
              if (pcVar10 + -1 == __filename) goto LAB_004fd2ea;
              __filename = __filename + 1;
              uVar3 = *piVar9;
              piVar9 = piVar9 + 0x21;
            } while (uVar3 != local_1c4);
            bVar21 = __filename < pcVar10;
          }
          if (!bVar21) goto LAB_004fd2ea;
        }
        if (-1 < (int)__filename) {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this_01,__filename);
        }
        bVar21 = 1 < lVar20;
        lVar20 = lVar20 + -1;
      } while (bVar21);
    }
    (pIVar2->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    pLVar14 = newRow;
    pnVar16 = &local_1b0;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pLVar14->left).m_backend.data._M_elems[0];
      pLVar14 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar14 + (ulong)bVar22 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (newRow->left).m_backend.exp;
    local_1b0.m_backend.neg = (newRow->left).m_backend.neg;
    local_1b0.m_backend.fpclass = (newRow->left).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (newRow->left).m_backend.prec_elem;
    bVar8 = (byte)local_1c0;
    uVar12 = (ulong)(byte)local_1c0;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x33])(this,(ulong)local_1c4,&local_1b0,uVar12);
    pnVar16 = &newRow->right;
    pnVar18 = &local_1b0;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (newRow->right).m_backend.exp;
    local_1b0.m_backend.neg = (newRow->right).m_backend.neg;
    local_1b0.m_backend.fpclass = (newRow->right).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (newRow->right).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x36])(this,(ulong)local_1c4,&local_1b0,(ulong)bVar8);
    pnVar16 = &newRow->object;
    pnVar18 = &local_1b0;
    for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (newRow->object).m_backend.exp;
    local_1b0.m_backend.neg = (newRow->object).m_backend.neg;
    local_1b0.m_backend.fpclass = (newRow->object).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (newRow->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x3c])(this,(ulong)local_1c4,&local_1b0,uVar12);
    lVar20 = (long)(newRow->vec).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (0 < lVar20) {
      this_00 = &this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      lVar13 = lVar20 + 1;
      lVar20 = lVar20 * 0x84 + -4;
      local_1b8 = this;
      do {
        piVar9 = (int *)((long)(((newRow->vec).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val).m_backend.data._M_elems + lVar20);
        local_1bc = *piVar9;
        puVar15 = (uint *)(piVar9 + -0x20);
        pnVar16 = &local_1b0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = piVar9[-4];
        iVar7 = piVar9[-3];
        local_1b0.m_backend.neg = (bool)(char)iVar7;
        piVar1 = piVar9 + -2;
        iVar4 = *piVar1;
        iVar5 = piVar9[-1];
        local_1b0.m_backend.fpclass = piVar1[0];
        local_1b0.m_backend.prec_elem = piVar1[1];
        if ((byte)local_1c0 != '\0') {
          pnVar16 = &local_1b0;
          psVar19 = local_130;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(uint *)psVar19 = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
            psVar19 = psVar19 + (ulong)bVar22 * -8 + 4;
          }
          piVar9 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).scaleExp.data;
          local_c0 = local_1b0.m_backend.exp;
          local_bc = (char)iVar7;
          local_b8 = iVar4;
          local_b4 = iVar5;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_b0,local_130,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)((this->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).scaleExp.data[local_1bc] + piVar9[(int)local_1c4]),
                     (int)piVar9);
          pnVar17 = &local_b0;
          pnVar16 = &local_1b0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                       *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = local_b0.m_backend.exp;
          local_1b0.m_backend.neg = local_b0.m_backend.neg;
          local_1b0.m_backend.fpclass = local_b0.m_backend.fpclass;
          local_1b0.m_backend.prec_elem = local_b0.m_backend.prec_elem;
          this = local_1b8;
        }
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_1c4,1,&local_1bc,&local_1b0);
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(this_00,local_1bc,1,(int *)&local_1c4,&local_1b0);
        lVar13 = lVar13 + -1;
        lVar20 = lVar20 + -0x84;
      } while (1 < lVar13);
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }